

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O0

void __thiscall
ParticleArrayTest_Back_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>::TestBody
          (ParticleArrayTest_Back_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>
           *this)

{
  Particle<(pica::Dimension)1> a;
  Particle<(pica::Dimension)1> a_00;
  Particle<(pica::Dimension)1> b;
  Particle<(pica::Dimension)1> b_00;
  bool bVar1;
  ParticleRef pPVar2;
  undefined8 in_RDI;
  AssertionResult gtest_ar__1;
  ParticleArray particlesCopy;
  AssertionResult gtest_ar_;
  ParticleType particle;
  int i;
  ParticleArray particles;
  ConstParticleRef in_stack_fffffffffffffd78;
  ConstParticleRef pPVar3;
  String *in_stack_fffffffffffffd80;
  String *this_00;
  char *pcVar4;
  undefined8 uVar5;
  int iVar6;
  char *pcVar7;
  undefined8 uVar8;
  Type TVar9;
  BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *in_stack_fffffffffffffdb0;
  AssertHelper *this_01;
  Message *pMVar10;
  BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *pBVar11;
  char *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  ConstParticleRef in_stack_fffffffffffffe00;
  undefined1 *puVar12;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  undefined1 in_stack_fffffffffffffe28 [32];
  undefined1 auVar13 [24];
  BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *in_stack_fffffffffffffe48;
  double in_stack_fffffffffffffe50;
  double in_stack_fffffffffffffe58;
  AssertionResult local_140 [2];
  String local_118 [2];
  AssertHelper *local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  FactorType local_d8;
  Message *pMStack_d0;
  BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *local_c8;
  ConstParticleRef local_b8;
  String *pSStack_b0;
  undefined8 local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  AssertionResult local_80 [2];
  ConstParticleRef local_60;
  String *pSStack_58;
  undefined8 local_50;
  char *pcStack_48;
  undefined8 local_40;
  char *pcStack_38;
  undefined8 local_30;
  int local_24;
  
  pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>::ParticleArrayAoS
            ((ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_> *)0x21e2bc);
  for (local_24 = 0; local_24 < 0xd; local_24 = local_24 + 1) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::randomParticle
              (in_stack_fffffffffffffdb0);
    pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>::pushBack
              ((ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_> *)in_stack_fffffffffffffd80,
               in_stack_fffffffffffffd78);
    local_88 = local_30;
    local_98 = local_40;
    pcStack_90 = pcStack_38;
    local_a8 = local_50;
    pcStack_a0 = pcStack_48;
    local_b8 = local_60;
    pSStack_b0 = pSStack_58;
    pPVar2 = pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>::back
                       ((ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_> *)0x21e350);
    pBVar11 = *(BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> **)&pPVar2->typeIndex;
    this_01 = (AssertHelper *)(pPVar2->position).x;
    dStack_f0 = (pPVar2->p).x;
    local_e8 = (pPVar2->p).y;
    dStack_e0 = (pPVar2->p).z;
    local_d8 = pPVar2->factor;
    pMVar10 = (Message *)pPVar2->invGamma;
    a.p.x._0_7_ = in_stack_fffffffffffffdf8;
    a.position.x = (double)in_stack_fffffffffffffdf0;
    a.p.x._7_1_ = in_stack_fffffffffffffdff;
    a.p.y = (double)in_stack_fffffffffffffe00;
    a.p.z = (double)&stack0xfffffffffffffd78;
    a.factor._0_7_ = in_stack_fffffffffffffe10;
    a.factor._7_1_ = in_stack_fffffffffffffe17;
    a.invGamma = (GammaType)pPVar2;
    a._48_8_ = in_RDI;
    b.factor = (FactorType)in_stack_fffffffffffffe48;
    auVar13 = in_stack_fffffffffffffe28._8_24_;
    b.position.x = (double)in_stack_fffffffffffffe28._0_8_;
    b.p.x = (double)auVar13._0_8_;
    b.p.y = (double)auVar13._8_8_;
    b.p.z = (double)auVar13._16_8_;
    b.invGamma = in_stack_fffffffffffffe50;
    b._48_8_ = in_stack_fffffffffffffe58;
    pPVar3 = local_b8;
    this_00 = pSStack_b0;
    pcVar4 = pcStack_a0;
    uVar5 = local_98;
    pcVar7 = pcStack_90;
    uVar8 = local_88;
    puVar12 = &stack0xfffffffffffffd78;
    local_f8 = this_01;
    pMStack_d0 = pMVar10;
    local_c8 = pBVar11;
    in_stack_fffffffffffffe17 =
         BaseParticleFixture<pica::Particle<(pica::Dimension)1>>::
         eqParticles_<pica::Particle<(pica::Dimension)1>,pica::Particle<(pica::Dimension)1>>
                   (pBVar11,a,b);
    TVar9 = (Type)((ulong)uVar8 >> 0x20);
    iVar6 = (int)((ulong)uVar5 >> 0x20);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)this_00,SUB81((ulong)pPVar3 >> 0x38,0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_80);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      testing::internal::GetBoolAssertionFailureMessage
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                 in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(char *)pBVar11);
      testing::internal::String::c_str(local_118);
      testing::internal::AssertHelper::AssertHelper(this_01,TVar9,pcVar7,iVar6,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)pBVar11,pMVar10);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::String::~String(this_00);
      testing::Message::~Message((Message *)0x21e507);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x21e59e);
    pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>::ParticleArrayAoS
              ((ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_> *)this_00,
               (ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_> *)pPVar3);
    uVar8 = local_30;
    pcVar7 = pcStack_38;
    uVar5 = local_40;
    pcVar4 = pcStack_48;
    in_stack_fffffffffffffd80 = pSStack_58;
    in_stack_fffffffffffffd78 = local_60;
    in_stack_fffffffffffffe00 =
         pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>::back
                   ((ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_> *)0x21e602);
    pBVar11 = *(BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> **)
               &in_stack_fffffffffffffe00->typeIndex;
    in_stack_fffffffffffffdb0 =
         (BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *)
         (in_stack_fffffffffffffe00->position).x;
    in_stack_fffffffffffffe50 = (in_stack_fffffffffffffe00->p).x;
    in_stack_fffffffffffffe58 = (in_stack_fffffffffffffe00->p).y;
    pMVar10 = (Message *)in_stack_fffffffffffffe00->invGamma;
    a_00.p.x._0_7_ = in_stack_fffffffffffffdf8;
    a_00.position.x = (double)&stack0xfffffffffffffd78;
    a_00.p.x._7_1_ = in_stack_fffffffffffffdff;
    a_00.p.y = (double)in_stack_fffffffffffffe00;
    a_00.p.z = (double)puVar12;
    a_00.factor._0_7_ = in_stack_fffffffffffffe10;
    a_00.factor._7_1_ = in_stack_fffffffffffffe17;
    a_00.invGamma = (GammaType)pPVar2;
    a_00._48_8_ = in_RDI;
    b_00.factor = (FactorType)in_stack_fffffffffffffdb0;
    auVar13 = in_stack_fffffffffffffe28._8_24_;
    b_00.position.x = (double)in_stack_fffffffffffffe28._0_8_;
    b_00.p.x = (double)auVar13._0_8_;
    b_00.p.y = (double)auVar13._8_8_;
    b_00.p.z = (double)auVar13._16_8_;
    b_00.invGamma = in_stack_fffffffffffffe50;
    b_00._48_8_ = in_stack_fffffffffffffe58;
    in_stack_fffffffffffffdf0 = &stack0xfffffffffffffd78;
    in_stack_fffffffffffffe48 = in_stack_fffffffffffffdb0;
    in_stack_fffffffffffffdff =
         BaseParticleFixture<pica::Particle<(pica::Dimension)1>>::
         eqParticles_<pica::Particle<(pica::Dimension)1>,pica::Particle<(pica::Dimension)1>>
                   (pBVar11,a_00,b_00);
    TVar9 = (Type)((ulong)uVar8 >> 0x20);
    iVar6 = (int)((ulong)uVar5 >> 0x20);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)in_stack_fffffffffffffd80,
               SUB81((ulong)in_stack_fffffffffffffd78 >> 0x38,0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_140);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffdb0);
      testing::internal::GetBoolAssertionFailureMessage
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                 in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(char *)pBVar11);
      testing::internal::String::c_str((String *)&stack0xfffffffffffffe28);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffdb0,TVar9,pcVar7,iVar6,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)pBVar11,pMVar10);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd80);
      testing::internal::String::~String(in_stack_fffffffffffffd80);
      testing::Message::~Message((Message *)0x21e7c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x21e85c);
    pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>::~ParticleArrayAoS
              ((ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_> *)0x21e869);
  }
  pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>::~ParticleArrayAoS
            ((ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_> *)0x21e8a8);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Back)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;
    typedef typename ParticleArrayTest<TypeParam>::Particle ParticleType;

    ParticleArray particles;
    for (int i = 0; i < 13; i++) {
        ParticleType particle = this->randomParticle();
        particles.pushBack(particle);
        EXPECT_TRUE(this->eqParticles_(particle, particles.back()));
        const ParticleArray particlesCopy = particles;
        EXPECT_TRUE(this->eqParticles_(particle, particlesCopy.back()));
    }
}